

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dec_loop.c
# Opt level: O2

int dec_loop_ssse3_inner(uint8_t **s,uint8_t **o,size_t *rounds)

{
  bool bVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  
  auVar5 = *(undefined1 (*) [16])*s;
  auVar2._0_4_ = auVar5._0_4_ >> 4;
  auVar2._4_4_ = auVar5._4_4_ >> 4;
  auVar2._8_4_ = auVar5._8_4_ >> 4;
  auVar2._12_4_ = auVar5._12_4_ >> 4;
  auVar2 = auVar2 & _DAT_00109ff0;
  auVar3 = pshufb(_DAT_0010a000,auVar2);
  auVar6 = pshufb(_DAT_0010a020,_DAT_0010a010 & auVar5);
  auVar6 = auVar6 & auVar3;
  auVar3[0] = -('\0' < auVar6[0]);
  auVar3[1] = -('\0' < auVar6[1]);
  auVar3[2] = -('\0' < auVar6[2]);
  auVar3[3] = -('\0' < auVar6[3]);
  auVar3[4] = -('\0' < auVar6[4]);
  auVar3[5] = -('\0' < auVar6[5]);
  auVar3[6] = -('\0' < auVar6[6]);
  auVar3[7] = -('\0' < auVar6[7]);
  auVar3[8] = -('\0' < auVar6[8]);
  auVar3[9] = -('\0' < auVar6[9]);
  auVar3[10] = -('\0' < auVar6[10]);
  auVar3[0xb] = -('\0' < auVar6[0xb]);
  auVar3[0xc] = -('\0' < auVar6[0xc]);
  auVar3[0xd] = -('\0' < auVar6[0xd]);
  auVar3[0xe] = -('\0' < auVar6[0xe]);
  bVar1 = '\0' < auVar6[0xf];
  auVar3[0xf] = -bVar1;
  if ((((((((((((((((auVar3 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar3 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar3 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar3 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar3 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (auVar3 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar3 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             (auVar3 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar3 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
           (auVar3 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar3 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
         (auVar3 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (auVar3 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
       (auVar3 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
      (auVar3 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) || bVar1) {
    return 0;
  }
  auVar6[0] = auVar2[0] - (auVar5[0] == '/');
  auVar6[1] = auVar2[1] - (auVar5[1] == '/');
  auVar6[2] = auVar2[2] - (auVar5[2] == '/');
  auVar6[3] = auVar2[3] - (auVar5[3] == '/');
  auVar6[4] = auVar2[4] - (auVar5[4] == '/');
  auVar6[5] = auVar2[5] - (auVar5[5] == '/');
  auVar6[6] = auVar2[6] - (auVar5[6] == '/');
  auVar6[7] = auVar2[7] - (auVar5[7] == '/');
  auVar6[8] = auVar2[8] - (auVar5[8] == '/');
  auVar6[9] = auVar2[9] - (auVar5[9] == '/');
  auVar6[10] = auVar2[10] - (auVar5[10] == '/');
  auVar6[0xb] = auVar2[0xb] - (auVar5[0xb] == '/');
  auVar6[0xc] = auVar2[0xc] - (auVar5[0xc] == '/');
  auVar6[0xd] = auVar2[0xd] - (auVar5[0xd] == '/');
  auVar6[0xe] = auVar2[0xe] - (auVar5[0xe] == '/');
  auVar6[0xf] = auVar2[0xf] - (auVar5[0xf] == '/');
  auVar2 = pshufb(ZEXT816(0xb9b9bfbf04131000),auVar6);
  auVar4[0] = auVar2[0] + auVar5[0];
  auVar4[1] = auVar2[1] + auVar5[1];
  auVar4[2] = auVar2[2] + auVar5[2];
  auVar4[3] = auVar2[3] + auVar5[3];
  auVar4[4] = auVar2[4] + auVar5[4];
  auVar4[5] = auVar2[5] + auVar5[5];
  auVar4[6] = auVar2[6] + auVar5[6];
  auVar4[7] = auVar2[7] + auVar5[7];
  auVar4[8] = auVar2[8] + auVar5[8];
  auVar4[9] = auVar2[9] + auVar5[9];
  auVar4[10] = auVar2[10] + auVar5[10];
  auVar4[0xb] = auVar2[0xb] + auVar5[0xb];
  auVar4[0xc] = auVar2[0xc] + auVar5[0xc];
  auVar4[0xd] = auVar2[0xd] + auVar5[0xd];
  auVar4[0xe] = auVar2[0xe] + auVar5[0xe];
  auVar4[0xf] = auVar2[0xf] + auVar5[0xf];
  auVar5 = pmaddubsw(auVar4,_DAT_0010a040);
  auVar5 = pmaddwd(auVar5,_DAT_0010a050);
  auVar5 = pshufb(auVar5,_DAT_0010a060);
  *(undefined1 (*) [16])*o = auVar5;
  *s = *s + 0x10;
  *o = *o + 0xc;
  *rounds = *rounds - 1;
  return 1;
}

Assistant:

static inline int
dec_loop_ssse3_inner (const uint8_t **s, uint8_t **o, size_t *rounds)
{
	const __m128i lut_lo = _mm_setr_epi8(
		0x15, 0x11, 0x11, 0x11, 0x11, 0x11, 0x11, 0x11,
		0x11, 0x11, 0x13, 0x1A, 0x1B, 0x1B, 0x1B, 0x1A);

	const __m128i lut_hi = _mm_setr_epi8(
		0x10, 0x10, 0x01, 0x02, 0x04, 0x08, 0x04, 0x08,
		0x10, 0x10, 0x10, 0x10, 0x10, 0x10, 0x10, 0x10);

	const __m128i lut_roll = _mm_setr_epi8(
		0,  16,  19,   4, -65, -65, -71, -71,
		0,   0,   0,   0,   0,   0,   0,   0);

	const __m128i mask_2F = _mm_set1_epi8(0x2F);

	// Load input:
	__m128i str = _mm_loadu_si128((__m128i *) *s);

	// Table lookups:
	const __m128i hi_nibbles = _mm_and_si128(_mm_srli_epi32(str, 4), mask_2F);
	const __m128i lo_nibbles = _mm_and_si128(str, mask_2F);
	const __m128i hi         = _mm_shuffle_epi8(lut_hi, hi_nibbles);
	const __m128i lo         = _mm_shuffle_epi8(lut_lo, lo_nibbles);

	// Check for invalid input: if any "and" values from lo and hi are not
	// zero, fall back on bytewise code to do error checking and reporting:
	if (_mm_movemask_epi8(_mm_cmpgt_epi8(_mm_and_si128(lo, hi), _mm_setzero_si128())) != 0) {
		return 0;
	}

	const __m128i eq_2F = _mm_cmpeq_epi8(str, mask_2F);
	const __m128i roll  = _mm_shuffle_epi8(lut_roll, _mm_add_epi8(eq_2F, hi_nibbles));

	// Now simply add the delta values to the input:
	str = _mm_add_epi8(str, roll);

	// Reshuffle the input to packed 12-byte output format:
	str = dec_reshuffle(str);

	// Store the output:
	_mm_storeu_si128((__m128i *) *o, str);

	*s += 16;
	*o += 12;
	*rounds -= 1;

	return 1;
}